

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O1

void __thiscall
AutoArgParse::RepeatedFlagException::~RepeatedFlagException(RepeatedFlagException *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_ParseException = &PTR__RepeatedFlagException_001119e8;
  pcVar2 = (this->repeatedFlag)._M_dataplus._M_p;
  paVar1 = &(this->repeatedFlag).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ParseException::~ParseException(&this->super_ParseException);
  return;
}

Assistant:

RepeatedFlagException(std::string repeatedFlag)
        : ParseException(REPEATED_FLAG, makeErrorMessage(repeatedFlag)),
          repeatedFlag(std::move(repeatedFlag)) {}